

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day18.cpp
# Opt level: O2

void day18(input_t input)

{
  undefined2 uVar1;
  longlong alVar2 [4];
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  pointer pMVar10;
  pointer pMVar11;
  _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *p_Var12;
  pointer pMVar13;
  size_t i;
  ulong uVar14;
  char **__args;
  char **extraout_RDX;
  char **__args_00;
  char *__s;
  pointer pMVar15;
  pointer pMVar16;
  uint uVar17;
  value_type *__u;
  pointer in_RDI;
  array<__attribute__((__vector_size__(4_*_sizeof(long_long))))_long_long,_2UL> *this;
  long lVar18;
  pointer pMVar19;
  pointer pMVar20;
  pointer __dest;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar31;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> seen;
  anon_struct_3264_2_6c3431b1 s;
  Map A;
  undefined1 local_1a40 [24];
  _Rb_tree_node_base local_1a28;
  longlong local_1a08;
  longlong local_1a00 [4];
  value_type_conflict3 local_19e0;
  undefined1 auStack_19de [30];
  longlong local_19c0 [4];
  undefined1 auStack_19a0 [32];
  undefined1 auStack_1980 [3104];
  array<__attribute__((__vector_size__(4_*_sizeof(long_long))))_long_long,_2UL> local_d60;
  undefined1 local_d20 [32];
  undefined1 auStack_d00 [3200];
  undefined1 local_80 [32];
  
  pMVar16 = DAT_00185998;
  pMVar15 = (anonymous_namespace)::History::V;
  local_1a28._M_left = &local_1a28;
  local_1a28._M_color = _S_red;
  local_1a28._M_parent = (_Base_ptr)0x0;
  local_1a08 = 0;
  __args = (char **)(((long)DAT_001859a0 - (long)(anonymous_namespace)::History::V) % 0xcc0);
  pMVar11 = (anonymous_namespace)::History::V;
  local_1a28._M_right = local_1a28._M_left;
  if ((ulong)(((long)DAT_001859a0 - (long)(anonymous_namespace)::History::V) / 0xcc0) < 1000) {
    pMVar10 = (pointer)operator_new(0x31ce00,0x20);
    pMVar11 = DAT_00185998;
    in_RDI = (anonymous_namespace)::History::V;
    for (lVar18 = 0;
        pMVar19 = (pointer)((long)&(((_Vector_impl *)in_RDI->pad0)->super__Vector_impl_data).
                                   _M_start + lVar18), pMVar19 != pMVar11; lVar18 = lVar18 + 0xcc0)
    {
      memcpy((void *)((long)&(((_Vector_impl *)pMVar10->pad0)->super__Vector_impl_data)._M_start +
                     lVar18),pMVar19,0xcc0);
    }
    pMVar11 = (pointer)(((long)DAT_001859a0 - (long)in_RDI) / 0xcc0);
    std::_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
    _M_deallocate((_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                   *)in_RDI,pMVar11,((long)DAT_001859a0 - (long)in_RDI) % 0xcc0);
    DAT_00185998 = (pointer)(((long)pMVar16 - (long)pMVar15) + (long)pMVar10);
    DAT_001859a0 = pMVar10 + 1000;
    __args = extraout_RDX;
    (anonymous_namespace)::History::V = pMVar10;
  }
  pMVar16 = DAT_001859a0;
  pMVar15 = DAT_00185998;
  if (DAT_00185998 == DAT_001859a0) {
    p_Var12 = (_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
               *)std::
                 vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
                 _M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                               *)in_RDI,(size_type)pMVar11,(char *)__args);
    pMVar19 = DAT_00185998;
    pMVar10 = (anonymous_namespace)::History::V;
    pMVar13 = std::
              _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
              ::_M_allocate(p_Var12,(size_t)pMVar11);
    std::allocator_traits<std::allocator<(anonymous_namespace)::Map>>::
    construct<(anonymous_namespace)::Map,char*&>
              ((allocator_type *)(((long)pMVar16 - (long)pMVar10) + (long)pMVar13),(Map *)local_1a40
               ,__args_00);
    pMVar11 = pMVar13;
    for (pMVar20 = pMVar10; __dest = pMVar11 + 1, pMVar20 != pMVar16; pMVar20 = pMVar20 + 1) {
      memcpy(pMVar11,pMVar20,0xcc0);
      pMVar11 = __dest;
    }
    for (; pMVar15 != pMVar19; pMVar15 = pMVar15 + 1) {
      memcpy(__dest,pMVar15,0xcc0);
      __dest = __dest + 1;
    }
    std::_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
    _M_deallocate((_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                   *)pMVar10,(pointer)(((long)DAT_001859a0 - (long)pMVar10) / 0xcc0),
                  ((long)DAT_001859a0 - (long)pMVar10) % 0xcc0);
    DAT_001859a0 = pMVar13 + (long)p_Var12;
    (anonymous_namespace)::History::V = pMVar13;
    DAT_00185998 = __dest;
  }
  else {
    std::allocator_traits<std::allocator<(anonymous_namespace)::Map>>::
    construct<(anonymous_namespace)::Map,char*&>
              ((allocator_type *)DAT_00185998,(Map *)local_1a40,__args);
    DAT_00185998 = DAT_00185998 + 1;
  }
  local_19e0 = 0;
  std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::insert
            ((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *
             )(local_1a40 + 0x10),&local_19e0);
  do {
    pMVar15 = DAT_00185998;
    this = &local_d60;
    __u = &local_1a00;
    local_1a00[0] = 0;
    local_1a00[1] = 0;
    local_1a00[2] = 0;
    local_1a00[3] = 0;
    std::array<__attribute__((__vector_size__(4_*_sizeof(long_long))))_long_long,_2UL>::fill
              (this,__u);
    pMVar16 = DAT_00185998;
    for (lVar18 = 0; lVar18 != 0xc80; lVar18 = lVar18 + 0x20) {
      auVar23 = vpaddb_avx2(*(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xca1),
                            *(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xca0));
      auVar23 = vpaddb_avx2(auVar23,*(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xc9f));
      *(undefined1 (*) [32])(auStack_19de + lVar18 + -2) = auVar23;
    }
    auVar23._2_30_ = auStack_19de;
    auVar23._0_2_ = local_19e0;
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    lVar18 = 0;
    uVar14 = 0;
    alVar2 = local_19c0;
    auVar22 = auVar23;
    while (uVar14 < 100) {
      auVar26 = *(undefined1 (*) [32])(auStack_19a0 + lVar18);
      auVar21 = vpaddb_avx2((undefined1  [32])alVar2,*(undefined1 (*) [32])(auStack_1980 + lVar18));
      uVar14 = uVar14 + 2;
      auVar23 = vpaddb_avx2(auVar26,auVar23);
      auVar24 = vpsubb_avx2(auVar23,*(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xca0));
      alVar2 = (longlong  [4])vpsubb_avx2(auVar21,auVar29._0_32_);
      auVar29 = ZEXT3264(*(undefined1 (*) [32])((long)local_19c0 + lVar18));
      auVar23 = vpsubb_avx2(auVar23,auVar25._0_32_);
      auVar25 = ZEXT3264(auVar22);
      *(undefined1 (*) [32])(auStack_19de + lVar18 + -2) = auVar24;
      auVar22 = vpsubb_avx2(auVar21,*(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xc80));
      *(undefined1 (*) [32])((long)local_19c0 + lVar18) = auVar22;
      lVar18 = lVar18 + 0x40;
      auVar22 = auVar26;
    }
    lVar18 = 0;
    local_80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    local_d20 = local_80;
    for (uVar14 = 0; uVar14 != 100; uVar14 = uVar14 + 1) {
      auVar28[8] = 0xf;
      auVar28._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar28[9] = 0xf;
      auVar28[10] = 0xf;
      auVar28[0xb] = 0xf;
      auVar28[0xc] = 0xf;
      auVar28[0xd] = 0xf;
      auVar28[0xe] = 0xf;
      auVar28[0xf] = 0xf;
      auVar28[0x10] = 0xf;
      auVar28[0x11] = 0xf;
      auVar28[0x12] = 0xf;
      auVar28[0x13] = 0xf;
      auVar28[0x14] = 0xf;
      auVar28[0x15] = 0xf;
      auVar28[0x16] = 0xf;
      auVar28[0x17] = 0xf;
      auVar28[0x18] = 0xf;
      auVar28[0x19] = 0xf;
      auVar28[0x1a] = 0xf;
      auVar28[0x1b] = 0xf;
      auVar28[0x1c] = 0xf;
      auVar28[0x1d] = 0xf;
      auVar28[0x1e] = 0xf;
      auVar28[0x1f] = 0xf;
      auVar30[8] = 2;
      auVar30._0_8_ = 0x202020202020202;
      auVar30[9] = 2;
      auVar30[10] = 2;
      auVar30[0xb] = 2;
      auVar30[0xc] = 2;
      auVar30[0xd] = 2;
      auVar30[0xe] = 2;
      auVar30[0xf] = 2;
      auVar30[0x10] = 2;
      auVar30[0x11] = 2;
      auVar30[0x12] = 2;
      auVar30[0x13] = 2;
      auVar30[0x14] = 2;
      auVar30[0x15] = 2;
      auVar30[0x16] = 2;
      auVar30[0x17] = 2;
      auVar30[0x18] = 2;
      auVar30[0x19] = 2;
      auVar30[0x1a] = 2;
      auVar30[0x1b] = 2;
      auVar30[0x1c] = 2;
      auVar30[0x1d] = 2;
      auVar30[0x1e] = 2;
      auVar30[0x1f] = 2;
      auVar23 = *(undefined1 (*) [32])((long)pMVar15 + lVar18 + -0xca0);
      auVar26 = vpsrlq_avx2(*(undefined1 (*) [32])(auStack_19de + lVar18 + -2),4);
      auVar22 = vpand_avx2(*(undefined1 (*) [32])(auStack_19de + lVar18 + -2),auVar28);
      auVar26 = vpand_avx2(auVar26,auVar28);
      uVar5 = vptestnmb_avx512vl(auVar22,auVar22);
      uVar6 = vptestnmb_avx512vl(auVar26,auVar26);
      uVar4 = vpcmpgtb_avx512vl(auVar26,auVar30);
      auVar27[8] = 0x10;
      auVar27._0_8_ = 0x1010101010101010;
      auVar27[9] = 0x10;
      auVar27[10] = 0x10;
      auVar27[0xb] = 0x10;
      auVar27[0xc] = 0x10;
      auVar27[0xd] = 0x10;
      auVar27[0xe] = 0x10;
      auVar27[0xf] = 0x10;
      auVar27[0x10] = 0x10;
      auVar27[0x11] = 0x10;
      auVar27[0x12] = 0x10;
      auVar27[0x13] = 0x10;
      auVar27[0x14] = 0x10;
      auVar27[0x15] = 0x10;
      auVar27[0x16] = 0x10;
      auVar27[0x17] = 0x10;
      auVar27[0x18] = 0x10;
      auVar27[0x19] = 0x10;
      auVar27[0x1a] = 0x10;
      auVar27[0x1b] = 0x10;
      auVar27[0x1c] = 0x10;
      auVar27[0x1d] = 0x10;
      auVar27[0x1e] = 0x10;
      auVar27[0x1f] = 0x10;
      uVar7 = vptestnmb_avx512vl(auVar23,auVar23);
      uVar3 = vpcmpeqb_avx512vl(auVar23,auVar27);
      auVar26 = vpmovm2b_avx512vl(uVar4 & uVar7);
      uVar4 = vpcmpgtb_avx512vl(auVar22,auVar30);
      auVar22 = vpmovm2b_avx512vl(uVar3 & uVar4);
      auVar21._8_8_ = 0x1111111111111111;
      auVar21._0_8_ = 0x1111111111111111;
      auVar21._16_8_ = 0x1111111111111111;
      auVar21._24_8_ = 0x1111111111111111;
      auVar21 = vpandq_avx512vl(auVar22,auVar21);
      auVar24[8] = 1;
      auVar24._0_8_ = 0x101010101010101;
      auVar24[9] = 1;
      auVar24[10] = 1;
      auVar24[0xb] = 1;
      auVar24[0xc] = 1;
      auVar24[0xd] = 1;
      auVar24[0xe] = 1;
      auVar24[0xf] = 1;
      auVar24[0x10] = 1;
      auVar24[0x11] = 1;
      auVar24[0x12] = 1;
      auVar24[0x13] = 1;
      auVar24[0x14] = 1;
      auVar24[0x15] = 1;
      auVar24[0x16] = 1;
      auVar24[0x17] = 1;
      auVar24[0x18] = 1;
      auVar24[0x19] = 1;
      auVar24[0x1a] = 1;
      auVar24[0x1b] = 1;
      auVar24[0x1c] = 1;
      auVar24[0x1d] = 1;
      auVar24[0x1e] = 1;
      auVar24[0x1f] = 1;
      auVar22._8_8_ = 0x1010101010101010;
      auVar22._0_8_ = 0x1010101010101010;
      auVar22._16_8_ = 0x1010101010101010;
      auVar22._24_8_ = 0x1010101010101010;
      auVar21 = vpternlogq_avx512vl(auVar21,auVar26,auVar22,0x78);
      uVar3 = vpcmpeqb_avx512vl(auVar23,auVar24);
      auVar22 = vpmovm2b_avx512vl(((uint)uVar6 | (uint)uVar5) & uVar3);
      auVar26._8_8_ = 0x101010101010101;
      auVar26._0_8_ = 0x101010101010101;
      auVar26._16_8_ = 0x101010101010101;
      auVar26._24_8_ = 0x101010101010101;
      auVar22 = vpandq_avx512vl(auVar22,auVar26);
      auVar23 = vpternlogq_avx512vl(auVar22,auVar23,auVar21,0x96);
      if ((uVar14 & 1) != 0) {
        auVar23 = vpand_avx2(auVar23,_DAT_00112ae0);
      }
      *(undefined1 (*) [32])(auStack_d00 + lVar18) = auVar23;
      lVar18 = lVar18 + 0x20;
    }
    if (DAT_00185998 == DAT_001859a0) {
      p_Var12 = (_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                 *)std::
                   vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
                   _M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                                 *)this,(size_type)__u,__s);
      pMVar10 = DAT_00185998;
      pMVar11 = (anonymous_namespace)::History::V;
      pMVar13 = std::
                _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                ::_M_allocate(p_Var12,(size_t)__u);
      memcpy((void *)(((long)pMVar16 - (long)pMVar11) + (long)pMVar13),local_d20,0xcc0);
      pMVar20 = pMVar13;
      pMVar15 = pMVar13;
      for (pMVar19 = pMVar11; pMVar15 = pMVar15 + 1, pMVar19 != pMVar16; pMVar19 = pMVar19 + 1) {
        memcpy(pMVar20,pMVar19,0xcc0);
        pMVar20 = pMVar20 + 1;
      }
      for (; pMVar16 != pMVar10; pMVar16 = pMVar16 + 1) {
        memcpy(pMVar15,pMVar16,0xcc0);
        pMVar15 = pMVar15 + 1;
      }
      std::_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
      _M_deallocate((_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                     *)pMVar11,(pointer)(((long)DAT_001859a0 - (long)pMVar11) / 0xcc0),
                    ((long)DAT_001859a0 - (long)pMVar11) % 0xcc0);
      DAT_001859a0 = pMVar13 + (long)p_Var12;
      (anonymous_namespace)::History::V = pMVar13;
      DAT_00185998 = pMVar15;
    }
    else {
      memcpy(DAT_00185998,local_d20,0xcc0);
      DAT_00185998 = pMVar16 + 1;
    }
    local_19e0 = (value_type_conflict3)local_1a08;
    pVar31 = std::
             set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::
             insert((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
                     *)(local_1a40 + 0x10),&local_19e0);
    pMVar15 = (anonymous_namespace)::History::V;
  } while (((undefined1  [16])pVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  uVar1 = (undefined2)pVar31.first._M_node._M_node[1]._M_color;
  uVar17 = (int)local_1a08 - (uint)(ushort)uVar1;
  uVar8 = anon_unknown.dwarf_7e949::Map::value((anonymous_namespace)::History::V + 10);
  uVar9 = anon_unknown.dwarf_7e949::Map::value
                    (pMVar15 + ((1000000000 - (ushort)uVar1) % uVar17 + (uint)(ushort)uVar1));
  printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n",(ulong)uVar8,(ulong)uVar9);
  std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::~set
            ((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *
             )(local_1a40 + 0x10));
  return;
}

Assistant:

void day18(input_t input) {
	std::set<uint16_t, History> seen;
	History::V.reserve(1000);
	History::V.emplace_back(input.s);
	seen.insert(0);

	uint32_t idx = 0;
	for (;;) {
		History::V.push_back(History::V.back().advance());
		auto result = seen.insert(seen.size());
		if (!result.second) {
			uint32_t base = *result.first, loop = seen.size() - base;
			idx = base + (1000000000 - base) % loop;
			break;
		}
	}

	printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n", History::V[10].value(), History::V[idx].value());
}